

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall
ON_MeshFaceList::GetVertexIndexInterval
          (ON_MeshFaceList *this,uint minimum_valid_vertex_index,uint maximum_valid_vertex_index,
          uint *minimum_vertex_index,uint *maximum_vertex_index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *local_58;
  uint *f;
  uint *f1;
  uint delta_f;
  uint face_vertex_count;
  uint valid_face_count;
  uint vi;
  uint v1;
  uint v0;
  uint vertex1;
  uint vertex0;
  uint *maximum_vertex_index_local;
  uint *minimum_vertex_index_local;
  uint maximum_valid_vertex_index_local;
  uint minimum_valid_vertex_index_local;
  ON_MeshFaceList *this_local;
  
  v0 = 0;
  v1 = 0;
  delta_f = 0;
  if (((this->m_face_count != 0) && (2 < this->m_face_stride)) && (this->m_faces != (uint *)0x0)) {
    iVar3 = 3;
    if ((this->m_bQuadFaces & 1U) != 0) {
      iVar3 = 4;
    }
    for (local_58 = this->m_faces;
        local_58 < this->m_faces + this->m_face_count * this->m_face_stride;
        local_58 = local_58 + (this->m_face_stride - iVar3)) {
      uVar1 = *local_58;
      uVar2 = local_58[1];
      valid_face_count = uVar1;
      vi = uVar2;
      if ((uVar1 <= uVar2) && (vi = uVar1, uVar1 < uVar2)) {
        valid_face_count = uVar2;
      }
      uVar1 = local_58[2];
      uVar2 = uVar1;
      if ((vi <= uVar1) && (uVar2 = vi, valid_face_count < uVar1)) {
        valid_face_count = uVar1;
      }
      vi = uVar2;
      puVar4 = local_58 + 3;
      uVar1 = vi;
      if ((this->m_bQuadFaces & 1U) != 0) {
        puVar4 = local_58 + 4;
        uVar2 = local_58[3];
        uVar1 = uVar2;
        if ((vi <= uVar2) && (uVar1 = vi, valid_face_count < uVar2)) {
          valid_face_count = uVar2;
        }
      }
      vi = uVar1;
      local_58 = puVar4;
      if ((minimum_valid_vertex_index <= vi) && (valid_face_count <= maximum_valid_vertex_index)) {
        if (delta_f == 0) {
          v0 = vi;
          v1 = valid_face_count;
        }
        else {
          if (vi < v0) {
            v0 = vi;
          }
          if (v1 < valid_face_count) {
            v1 = valid_face_count;
          }
        }
        delta_f = delta_f + 1;
      }
    }
  }
  if (minimum_vertex_index != (uint *)0x0) {
    *minimum_vertex_index = v0;
  }
  if (maximum_vertex_index != (uint *)0x0) {
    *maximum_vertex_index = v1;
  }
  return delta_f;
}

Assistant:

unsigned int ON_MeshFaceList::GetVertexIndexInterval(
  unsigned int minimum_valid_vertex_index,
  unsigned int maximum_valid_vertex_index,
  unsigned int* minimum_vertex_index,
  unsigned int* maximum_vertex_index
  ) const
{
  unsigned int vertex0 = 0;
  unsigned int vertex1 = 0;
  unsigned int v0, v1, vi;
  unsigned int valid_face_count = 0;
  for (;;)
  {
    if (0 == m_face_count || m_face_stride < 3 || nullptr == m_faces)
      break;
    const unsigned int face_vertex_count = m_bQuadFaces ? 4 : 3;
    const unsigned int delta_f = m_face_stride - face_vertex_count;
    const unsigned int* f1 = m_faces + (m_face_count*m_face_stride);
    for (const unsigned int* f = m_faces; f < f1; f += delta_f)
    {
      v0 = v1 = *f++;
      vi = *f++;
      if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      vi = *f++;
      if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      if (m_bQuadFaces)
      {
        vi = *f++;
        if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      }
      if (v0 < minimum_valid_vertex_index || v1 > maximum_valid_vertex_index)
        continue;
      if (0 == valid_face_count)
      {
        vertex0 = v0;
        vertex1 = v1;
      }
      else
      {
        if (v0 < vertex0)
          vertex0 = v0;
        if (v1 > vertex1)
          vertex1 = v1;
      }
      valid_face_count++;
    }
    break;
  }
  if (minimum_vertex_index)
    *minimum_vertex_index = vertex0;
  if (maximum_vertex_index)
    *maximum_vertex_index = vertex1;
  return valid_face_count;
}